

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O2

void __thiscall
cnn::InnerProduct3D_1D::forward_impl
          (InnerProduct3D_1D *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx)

{
  pointer ppTVar1;
  TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer> A;
  TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> C;
  TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer> local_e8;
  TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> local_c8;
  TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> local_b0;
  TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>
  local_98;
  
  Tensor::t<3>(&local_e8,
               *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                _M_impl.super__Vector_impl_data._M_start);
  local_98.m_lhs_xpr.m_rhs_xpr =
       Tensor::t<1>((xs->
                    super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                    _M_impl.super__Vector_impl_data._M_start[1]);
  ppTVar1 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((long)(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 == 0x10) {
    local_98.m_lhs_xpr.m_lhs_xpr.m_data = local_e8.m_data;
    local_98.m_lhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[0] =
         local_e8.m_dimensions.super_array<long,_3>._M_elems[0];
    local_98.m_lhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[1] =
         local_e8.m_dimensions.super_array<long,_3>._M_elems[1];
    local_98.m_lhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[2] =
         local_e8.m_dimensions.super_array<long,_3>._M_elems[2];
    local_98.m_lhs_xpr.m_indices._M_elems[0].first = 2;
    local_98.m_lhs_xpr.m_indices._M_elems[0].second = 0;
    Tensor::t<2>(&local_c8,fx);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,1>::
    operator=((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,1> *)
              &local_c8,&local_98.m_lhs_xpr);
  }
  else {
    Tensor::t<2>(&local_c8,ppTVar1[2]);
    local_98.m_lhs_xpr.m_lhs_xpr.m_data = local_e8.m_data;
    local_98.m_lhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[0] =
         local_e8.m_dimensions.super_array<long,_3>._M_elems[0];
    local_98.m_lhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[1] =
         local_e8.m_dimensions.super_array<long,_3>._M_elems[1];
    local_98.m_lhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[2] =
         local_e8.m_dimensions.super_array<long,_3>._M_elems[2];
    local_98.m_lhs_xpr.m_indices._M_elems[0].first = 2;
    local_98.m_lhs_xpr.m_indices._M_elems[0].second = 0;
    local_98.m_rhs_xpr.m_data = local_c8.m_data;
    local_98.m_rhs_xpr.m_dimensions.super_array<long,_2>._M_elems[0] =
         local_c8.m_dimensions.super_array<long,_2>._M_elems[0];
    local_98.m_rhs_xpr.m_dimensions.super_array<long,_2>._M_elems[1] =
         local_c8.m_dimensions.super_array<long,_2>._M_elems[1];
    Tensor::t<2>(&local_b0,fx);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,1>::
    operator=((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,1> *)
              &local_b0,&local_98);
  }
  return;
}

Assistant:

void InnerProduct3D_1D::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
  auto A = xs[0]->t<3>();
  auto b = xs[1]->t<1>();
  typedef Eigen::Tensor<float, 1>::DimensionPair DimPair;
  Eigen::array<DimPair, 1> dims({{DimPair(2, 0)}});
  if (xs.size() == 2) {
    fx.t<2>() = A.contract(b, dims);
  } else {
    auto C = xs[2]->t<2>();
    fx.t<2>() = A.contract(b, dims) + C;
  }
}